

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrElse.cpp
# Opt level: O0

void __thiscall
FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
          (FactoredQLastTimeStepOrElse *this,void **vtt,PlanningUnitFactoredDecPOMDPDiscrete *puf)

{
  QFunctionForFactoredDecPOMDP *in_RSI;
  void **in_RDI;
  void **in_stack_ffffffffffffffd8;
  FactoredQFunctionStateJAOHInterface *in_stack_ffffffffffffffe0;
  
  FactoredQFunctionStateJAOHInterface::FactoredQFunctionStateJAOHInterface
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  QFunctionForFactoredDecPOMDP::QFunctionForFactoredDecPOMDP
            (in_RSI,in_RDI,(PlanningUnitFactoredDecPOMDPDiscrete *)0x8da9aa);
  *in_RDI = *(void **)in_RSI;
  *(sp_counted_base **)((long)in_RDI + *(long *)((long)*in_RDI + -0x80)) =
       in_RSI[2]._m_pufShared.pn.pi_;
  *(long *)((long)in_RDI + *(long *)((long)*in_RDI + -0x60)) = *(long *)(in_RSI + 3);
  in_RDI[1] = in_RSI[3]._m_puf;
  *(element_type **)((long)in_RDI + *(long *)((long)*in_RDI + -0x88)) = in_RSI[3]._m_pufShared.px;
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0x8da9fc);
  *(undefined1 *)(in_RDI + 5) = 0;
  return;
}

Assistant:

FactoredQLastTimeStepOrElse::
FactoredQLastTimeStepOrElse(const PlanningUnitFactoredDecPOMDPDiscrete *puf) :
    QFunctionForFactoredDecPOMDP(puf)
{
    _m_initialized = false;
}